

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutazioneI.cpp
# Opt level: O3

unsigned_short __thiscall PermutazioneI::lisLength(PermutazioneI *this,PermutazioneI *p)

{
  undefined8 in_RAX;
  unsigned_short *l;
  unsigned_short *q;
  PermutazioneI *this_00;
  unsigned_short llis;
  int imax;
  unsigned_short local_26;
  int local_24;
  
  local_26 = (unsigned_short)((ulong)in_RAX >> 0x10);
  this_00 = (PermutazioneI *)(ulong)((uint)(p->super_Permutazione).dimensione * 2);
  l = (unsigned_short *)operator_new__((ulong)this_00);
  q = (unsigned_short *)operator_new__((ulong)this_00);
  createLengthsArray(this_00,p,l,q,&local_26,&local_24);
  operator_delete__(l);
  operator_delete__(q);
  return local_26;
}

Assistant:

unsigned short PermutazioneI::lisLength(PermutazioneI* p) {
	unsigned short llis;
	int  imax;

	unsigned short* l = new unsigned short[p->dimensione];
	unsigned short* q = new unsigned short[p->dimensione];

	createLengthsArray(p, l, q, llis, imax);

	delete[] l;
	delete[] q;
	return llis;
}